

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> __thiscall
llvm::yaml::Input::createHNodes(Input *this,Node *N)

{
  int iVar1;
  KeyValueNode *this_00;
  long *plVar2;
  undefined1 auVar3 [8];
  undefined4 uVar4;
  Child CVar5;
  _func_int *__dest;
  ScalarNode *node;
  Node *pNVar6;
  void *pvVar7;
  _func_int **pp_Var8;
  char *__function;
  SequenceNode *in_RDX;
  ptrdiff_t _Num;
  ulong uVar9;
  ScalarNode *this_01;
  StringRef SVar10;
  StringRef Key;
  pair<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_bool>
  pVar11;
  undefined1 local_100 [8];
  SmallString<128U> StringStorage;
  Child local_58;
  unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> ValueHNode;
  iterator local_38;
  iterator __begin5;
  
  local_100 = (undefined1  [8])
              &StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
               super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
               .super_SmallVectorBase.Size;
  StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  if (in_RDX == (SequenceNode *)0x0) {
    __assert_fail("Val && \"isa<> used on a null pointer\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                  ,0x69,
                  "static bool llvm::isa_impl_cl<llvm::yaml::ScalarNode, const llvm::yaml::Node *>::doit(const From *) [To = llvm::yaml::ScalarNode, From = const llvm::yaml::Node *]"
                 );
  }
  switch((in_RDX->super_Node).TypeID) {
  case 0:
    pp_Var8 = (_func_int **)operator_new(0x10);
    pp_Var8[1] = (_func_int *)in_RDX;
    *pp_Var8 = (_func_int *)&PTR_anchor_01099bc8;
    break;
  case 1:
    SVar10 = ScalarNode::getValue((ScalarNode *)in_RDX,(SmallVectorImpl<char> *)local_100);
    auVar3 = local_100;
    uVar4 = StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.BeginX._0_4_;
    uVar9 = (ulong)StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
            0xffffffff;
    if (uVar9 != 0) {
      pvVar7 = BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                          &N[1].Anchor,uVar9,(Align)0x0);
      SVar10.Length._0_4_ = uVar4;
      SVar10.Data = (char *)pvVar7;
      SVar10.Length._4_4_ = 0;
      memmove(pvVar7,(void *)auVar3,uVar9);
    }
    pp_Var8 = (_func_int **)operator_new(0x20);
    pp_Var8[1] = (_func_int *)in_RDX;
    *pp_Var8 = (_func_int *)&PTR_anchor_01099bf0;
    *(StringRef *)(pp_Var8 + 2) = SVar10;
    break;
  case 2:
    pNVar6 = in_RDX->CurrentEntry;
    if (pNVar6 == (Node *)0x0) {
      __dest = (_func_int *)0x0;
      pNVar6 = (Node *)0x0;
    }
    else {
      pvVar7 = *(void **)&in_RDX->SeqType;
      __dest = (_func_int *)
               BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                          &N[1].Anchor,(size_t)pNVar6,(Align)0x0);
      memmove(__dest,pvVar7,(size_t)pNVar6);
    }
    pp_Var8 = (_func_int **)operator_new(0x20);
    pp_Var8[1] = (_func_int *)in_RDX;
    *pp_Var8 = (_func_int *)&PTR_anchor_01099bf0;
    pp_Var8[2] = __dest;
    pp_Var8[3] = (_func_int *)pNVar6;
    break;
  default:
    Twine::Twine((Twine *)&local_58,"unknown node kind");
    setError((Input *)N,&in_RDX->super_Node,(Twine *)&local_58);
    (this->super_IO)._vptr_IO = (_func_int **)0x0;
    pp_Var8 = (_func_int **)0x0;
    break;
  case 4:
    pp_Var8 = (_func_int **)operator_new(0x100);
    pp_Var8[1] = (_func_int *)in_RDX;
    *pp_Var8 = (_func_int *)&PTR_anchor_01099c18;
    pp_Var8[2] = (_func_int *)0x0;
    pp_Var8[3] = (_func_int *)0x0;
    pp_Var8[4] = (_func_int *)0x1000000000;
    pp_Var8[6] = (_func_int *)(pp_Var8 + 8);
    pp_Var8[7] = (_func_int *)0x600000000;
    local_38 = begin<llvm::yaml::MappingNode>((MappingNode *)in_RDX);
    StringStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
    _120_8_ = &N[1].Anchor;
    while (local_38.Base != (MappingNode *)0x0) {
      this_00 = (local_38.Base)->CurrentEntry;
      if (this_00 == (KeyValueNode *)0x0) {
        __function = 
        "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode, llvm::yaml::KeyValueNode>::operator*() const [BaseT = llvm::yaml::MappingNode, ValueT = llvm::yaml::KeyValueNode]"
        ;
LAB_00dc4a34:
        __assert_fail("Base && Base->CurrentEntry && \"Attempted to dereference end iterator!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/YAMLParser.h"
                      ,0x150,__function);
      }
      node = (ScalarNode *)KeyValueNode::getKey(this_00);
      if ((node == (ScalarNode *)0x0) || (this_01 = node, (node->super_Node).TypeID != 1)) {
        this_01 = (ScalarNode *)0x0;
      }
      pNVar6 = KeyValueNode::getValue(this_00);
      if ((this_01 == (ScalarNode *)0x0) || (pNVar6 == (Node *)0x0)) {
        if (this_01 == (ScalarNode *)0x0) {
          Twine::Twine((Twine *)&local_58,"Map key must be a scalar");
          setError((Input *)N,(Node *)node,(Twine *)&local_58);
        }
        if (pNVar6 == (Node *)0x0) {
          Twine::Twine((Twine *)&local_58,"Map value must not be empty");
          setError((Input *)N,(Node *)node,(Twine *)&local_58);
        }
        break;
      }
      StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX =
           (void *)((ulong)StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                   & 0xffffffff00000000);
      Key = ScalarNode::getValue(this_01,(SmallVectorImpl<char> *)local_100);
      auVar3 = local_100;
      uVar4 = StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.BeginX._0_4_;
      uVar9 = (ulong)StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
              0xffffffff;
      if (uVar9 != 0) {
        pvVar7 = BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                           ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                            StringStorage.super_SmallVector<char,_128U>.
                            super_SmallVectorStorage<char,_128U>.InlineElts._120_8_,uVar9,(Align)0x0
                           );
        Key.Length._0_4_ = uVar4;
        Key.Data = (char *)pvVar7;
        Key.Length._4_4_ = 0;
        memmove(pvVar7,(void *)auVar3,uVar9);
      }
      createHNodes((Input *)&local_58,N);
      iVar1 = *(int *)&N[1].SourceRange.End.Ptr;
      if (iVar1 == 0) {
        pVar11 = StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
                 ::try_emplace<>((StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
                                  *)(pp_Var8 + 2),Key);
        CVar5 = local_58;
        local_58.twine = (Twine *)0x0;
        plVar2 = *(long **)(*(long *)pVar11.first.
                                     super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                                     .Ptr.
                                     super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                           + 8);
        ((Child *)
        (*(long *)pVar11.first.
                  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                  .Ptr.
                  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
        + 8))->decUL = (unsigned_long *)CVar5;
        if (plVar2 != (long *)0x0) {
          (**(code **)(*plVar2 + 0x10))();
        }
      }
      if ((SequenceNode *)local_58.twine != (SequenceNode *)0x0) {
        (**(code **)(*local_58.decUL + 0x10))();
      }
      if (iVar1 != 0) break;
      basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator++
                (&stack0xffffffffffffffc8);
    }
    break;
  case 5:
    pp_Var8 = (_func_int **)operator_new(0x28);
    pp_Var8[1] = (_func_int *)in_RDX;
    *pp_Var8 = (_func_int *)&PTR_anchor_01099c40;
    pp_Var8[2] = (_func_int *)0x0;
    pp_Var8[3] = (_func_int *)0x0;
    pp_Var8[4] = (_func_int *)0x0;
    local_58 = (Child)begin<llvm::yaml::SequenceNode>(in_RDX);
    while ((SequenceNode *)local_58.twine != (SequenceNode *)0x0) {
      if ((Node *)local_58.twine[3].RHS.twine == (Node *)0x0) {
        __function = 
        "ValueT &llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode, llvm::yaml::Node>::operator*() const [BaseT = llvm::yaml::SequenceNode, ValueT = llvm::yaml::Node]"
        ;
        goto LAB_00dc4a34;
      }
      createHNodes((Input *)&stack0xffffffffffffffc8,N);
      if (*(int *)&N[1].SourceRange.End.Ptr != 0) {
        if (local_38.Base != (MappingNode *)0x0) {
          (*((local_38.Base)->super_Node)._vptr_Node[2])();
        }
        break;
      }
      std::
      vector<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>,std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>>>
      ::
      emplace_back<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>>
                ((vector<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>,std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>>>
                  *)(pp_Var8 + 2),
                 (unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                  *)&stack0xffffffffffffffc8);
      if (local_38.Base != (MappingNode *)0x0) {
        (*((local_38.Base)->super_Node)._vptr_Node[2])();
      }
      basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++
                ((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> *)&local_58)
      ;
    }
  }
  (this->super_IO)._vptr_IO = pp_Var8;
  if (local_100 !=
      (undefined1  [8])
      &StringStorage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size) {
    free((void *)local_100);
  }
  return (__uniq_ptr_data<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>,_true,_true>
          )(__uniq_ptr_data<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Input::HNode> Input::createHNodes(Node *N) {
  SmallString<128> StringStorage;
  if (ScalarNode *SN = dyn_cast<ScalarNode>(N)) {
    StringRef KeyStr = SN->getValue(StringStorage);
    if (!StringStorage.empty()) {
      // Copy string to permanent storage
      KeyStr = StringStorage.str().copy(StringAllocator);
    }
    return std::make_unique<ScalarHNode>(N, KeyStr);
  } else if (BlockScalarNode *BSN = dyn_cast<BlockScalarNode>(N)) {
    StringRef ValueCopy = BSN->getValue().copy(StringAllocator);
    return std::make_unique<ScalarHNode>(N, ValueCopy);
  } else if (SequenceNode *SQ = dyn_cast<SequenceNode>(N)) {
    auto SQHNode = std::make_unique<SequenceHNode>(N);
    for (Node &SN : *SQ) {
      auto Entry = createHNodes(&SN);
      if (EC)
        break;
      SQHNode->Entries.push_back(std::move(Entry));
    }
    return std::move(SQHNode);
  } else if (MappingNode *Map = dyn_cast<MappingNode>(N)) {
    auto mapHNode = std::make_unique<MapHNode>(N);
    for (KeyValueNode &KVN : *Map) {
      Node *KeyNode = KVN.getKey();
      ScalarNode *Key = dyn_cast_or_null<ScalarNode>(KeyNode);
      Node *Value = KVN.getValue();
      if (!Key || !Value) {
        if (!Key)
          setError(KeyNode, "Map key must be a scalar");
        if (!Value)
          setError(KeyNode, "Map value must not be empty");
        break;
      }
      StringStorage.clear();
      StringRef KeyStr = Key->getValue(StringStorage);
      if (!StringStorage.empty()) {
        // Copy string to permanent storage
        KeyStr = StringStorage.str().copy(StringAllocator);
      }
      auto ValueHNode = createHNodes(Value);
      if (EC)
        break;
      mapHNode->Mapping[KeyStr] = std::move(ValueHNode);
    }
    return std::move(mapHNode);
  } else if (isa<NullNode>(N)) {
    return std::make_unique<EmptyHNode>(N);
  } else {
    setError(N, "unknown node kind");
    return nullptr;
  }
}